

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 617_mergeTwoBinaryTrees.cpp
# Opt level: O0

void printnode(TreeNode *root)

{
  bool bVar1;
  reference ppTVar2;
  ostream *poVar3;
  undefined1 local_60 [8];
  queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> q;
  TreeNode *root_local;
  
  q.c.super__Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)root;
  std::queue<TreeNode*,std::deque<TreeNode*,std::allocator<TreeNode*>>>::
  queue<std::deque<TreeNode*,std::allocator<TreeNode*>>,void>
            ((queue<TreeNode*,std::deque<TreeNode*,std::allocator<TreeNode*>>> *)local_60);
  std::queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_>::push
            ((queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> *)local_60,
             (value_type *)
             &q.c.super__Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  while (bVar1 = std::queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_>::empty
                           ((queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_>
                             *)local_60), !bVar1) {
    ppTVar2 = std::queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_>::front
                        ((queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> *)
                         local_60);
    q.c.super__Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_node = (_Map_pointer)*ppTVar2;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        ((value_type)
                        q.c.super__Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node)->val);
    std::operator<<(poVar3,", ");
    std::queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_>::pop
              ((queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> *)local_60);
    if (q.c.super__Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node[1] != (TreeNode **)0x0) {
      std::queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_>::push
                ((queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> *)local_60
                 ,(value_type *)
                  (q.c.super__Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node + 1));
    }
    if (q.c.super__Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node[2] != (TreeNode **)0x0) {
      std::queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_>::push
                ((queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> *)local_60
                 ,(value_type *)
                  (q.c.super__Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node + 2));
    }
  }
  std::queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_>::~queue
            ((queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> *)local_60);
  return;
}

Assistant:

void printnode(TreeNode* root)
{
	queue<TreeNode*> q;
	q.push(root);
	while (q.empty()==false)
	{
		root = q.front();
		cout<<root->val<<", ";
		q.pop();
		if (root->left!=nullptr)
			q.push(root->left);
		if (root->right!=nullptr)
			q.push(root->right);
	}
}